

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.h
# Opt level: O2

bool __thiscall
crnlib::mip_level::unflip
          (mip_level *this,bool allow_unpacking_to_flip,bool uncook_if_necessary_to_unpack)

{
  bool bVar1;
  orientation_flags_t oVar2;
  
  if (this->m_pImage == (image_u8 *)0x0 && this->m_pDXTImage == (dxt_image *)0x0) {
    return false;
  }
  if ((this->m_orient_flags & (cOrientationFlagYFlipped|cOrientationFlagXFlipped)) ==
      cDefaultOrientationFlags) {
    return false;
  }
  if (this->m_pDXTImage != (dxt_image *)0x0) {
    bVar1 = can_unflip_without_unpacking(this);
    if (bVar1) {
      oVar2 = this->m_orient_flags;
      if ((oVar2 & cOrientationFlagXFlipped) != cDefaultOrientationFlags) {
        dxt_image::flip_x(this->m_pDXTImage);
        oVar2 = this->m_orient_flags & ~cOrientationFlagXFlipped;
        this->m_orient_flags = oVar2;
      }
      if ((oVar2 & cOrientationFlagYFlipped) == cDefaultOrientationFlags) {
        return true;
      }
      dxt_image::flip_y(this->m_pDXTImage);
      goto LAB_001223fc;
    }
    if (!allow_unpacking_to_flip) {
      return false;
    }
  }
  unpack_from_dxt(this,false);
  oVar2 = this->m_orient_flags;
  if ((oVar2 & cOrientationFlagXFlipped) != cDefaultOrientationFlags) {
    image<crnlib::color_quad<unsigned_char,_int>_>::flip_x(this->m_pImage);
    oVar2 = this->m_orient_flags & ~cOrientationFlagXFlipped;
    this->m_orient_flags = oVar2;
  }
  if ((oVar2 & cOrientationFlagYFlipped) == cDefaultOrientationFlags) {
    return true;
  }
  image<crnlib::color_quad<unsigned_char,_int>_>::flip_y(this->m_pImage);
LAB_001223fc:
  *(undefined1 *)&this->m_orient_flags = (char)this->m_orient_flags & 0xfd;
  return true;
}

Assistant:

inline bool is_valid() const { return (m_pImage != nullptr) || (m_pDXTImage != nullptr); }